

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.cc
# Opt level: O1

void __thiscall Graph::trim(Graph *this)

{
  pointer *ppGVar1;
  pointer __src;
  long lVar2;
  pointer pGVar3;
  pointer pGVar4;
  ulong uVar5;
  long lVar6;
  pointer pGVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  iterator __begin2;
  pointer pGVar11;
  bool bVar12;
  
  pGVar7 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar11 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pGVar11 != pGVar7) {
    uVar9 = 0;
    do {
      for (; pGVar7 != pGVar11; pGVar7 = pGVar7 + 1) {
        pGVar3 = (pGVar7->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pGVar4 = (pGVar7->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pGVar4 != pGVar3) {
          lVar10 = 0x10;
          lVar6 = -0x10;
          uVar5 = 0;
          do {
            lVar2 = *(long *)((long)pGVar3 + lVar10 + -8);
            if ((ulong)(*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20)) < 0x11) {
              __src = (pointer)((long)&pGVar3->weight + lVar10);
              if (__src != pGVar4) {
                memmove((void *)((long)&pGVar3[-1].weight + lVar10),__src,
                        (long)pGVar4 + (lVar6 - (long)pGVar3));
              }
              ppGVar1 = &(pGVar7->edges).
                         super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppGVar1 = *ppGVar1 + -1;
            }
            uVar5 = uVar5 + 1;
            pGVar3 = (pGVar7->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pGVar4 = (pGVar7->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar10 = lVar10 + 0x10;
            lVar6 = lVar6 + -0x10;
          } while (uVar5 < (ulong)((long)pGVar4 - (long)pGVar3 >> 4));
        }
      }
      uVar9 = uVar9 + 1;
      pGVar7 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl
               .super__Vector_impl_data._M_start;
      pGVar11 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar9 < (ulong)((long)pGVar11 - (long)pGVar7 >> 6));
  }
  pGVar7 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
      super__Vector_impl_data._M_finish == pGVar7) {
    uVar9 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if ((ulong)((long)pGVar7[uVar5].edges.
                        super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)pGVar7[uVar5].edges.
                       super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>._M_impl.
                       super__Vector_impl_data._M_start) < 0x11) {
        std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::_M_erase
                  (&this->nodes,pGVar7 + uVar5);
        bVar12 = uVar5 < 2;
        uVar5 = uVar5 - 2;
        if (bVar12) {
          uVar5 = 0;
        }
      }
      uVar5 = uVar5 + 1;
      pGVar7 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar9 = (long)(this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pGVar7 >> 6;
    } while (uVar5 < uVar9);
  }
  if (uVar9 != 0) {
    piVar8 = &pGVar7->key;
    uVar5 = 0;
    do {
      *piVar8 = (int)uVar5;
      uVar5 = uVar5 + 1;
      piVar8 = piVar8 + 0x10;
    } while (uVar9 != uVar5);
  }
  return;
}

Assistant:

void Graph::trim() {
    // remove all bad edges from nodes
    for (unsigned long int i = 0;
         i < nodes.size(); ++i) { // this needs to be done probably fewer times, try and prove this
        for (auto & node : nodes) {
            for (unsigned long int x = 0; x < node.edges.size(); ++x) {
                if (node.edges.at(x).node->edges.size() < 2) {
                    node.edges.erase(node.edges.begin() + x);
                }
            }
        }
    }


    // remove all nodes with only one edge
    for (unsigned long int i = 0; i < nodes.size(); ++i) {
        if (nodes.at(i).edges.size() < 2) {
            nodes.erase(nodes.begin() + i);
            if (i < 2) {
                i = 0;
            } else {
                i -= 2;
            }
        }
    }

    // reset all of the key values
    for (unsigned long int j = 0; j < nodes.size(); ++j) {
        nodes.at(j).key = j;
    }

}